

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pugixml.cpp
# Opt level: O1

xpath_string * __thiscall
pugi::impl::anon_unknown_0::xpath_ast_node::eval_string
          (xpath_string *__return_storage_ptr__,xpath_ast_node *this,xpath_context *c,
          xpath_stack *stack)

{
  xpath_stack xVar1;
  char cVar2;
  undefined8 uVar3;
  undefined8 __s;
  bool bVar4;
  char *pcVar5;
  anon_union_8_5_7bd254c6_for__data aVar6;
  xpath_ast_node *pxVar7;
  byte *pbVar8;
  char_t *pcVar9;
  xml_node_struct *pxVar10;
  undefined1 *puVar11;
  ulong uVar12;
  byte *pbVar13;
  size_t sVar14;
  xml_attribute xVar15;
  char *pcVar16;
  long lVar17;
  char_t *pcVar18;
  char_t *pcVar19;
  byte *pbVar20;
  char *pcVar21;
  byte bVar22;
  xml_node_struct **ppxVar23;
  long lVar24;
  undefined1 *puVar25;
  char_t cVar26;
  double dVar27;
  undefined1 auVar28 [16];
  xml_node xVar29;
  undefined1 auVar30 [16];
  xpath_node xVar31;
  double v;
  xpath_allocator_capture local_c8;
  undefined1 local_a8 [16];
  xml_node_struct *local_98;
  xml_node local_88;
  undefined1 local_80 [16];
  ulong local_70;
  undefined1 local_68 [16];
  size_t local_58;
  xpath_string *local_48;
  xpath_stack local_40;
  
LAB_0015fa6a:
  switch(this->_type) {
  case '\x12':
    goto switchD_0015fa82_caseD_12;
  default:
    goto switchD_0015fa82_caseD_13;
  case '\x14':
    if (this->_rettype == '\x03') {
      if (((this->_data).variable)->_type == xpath_type_string) {
        pcVar16 = *(char **)((this->_data).variable + 1);
      }
      else {
        pcVar16 = (char *)0x0;
      }
      pcVar5 = "";
      if (pcVar16 != (char *)0x0) {
        pcVar5 = pcVar16;
      }
      __return_storage_ptr__->_buffer = pcVar5;
      goto LAB_0016016c;
    }
switchD_0015fa82_caseD_13:
    cVar2 = this->_rettype;
    if (cVar2 != '\x01') {
      if (cVar2 == '\x02') {
        dVar27 = eval_number(this,c,stack);
        convert_number_to_string(__return_storage_ptr__,dVar27,stack->result);
        return __return_storage_ptr__;
      }
      if (cVar2 != '\x04') {
LAB_00160162:
        aVar6.string = "";
        goto LAB_00160169;
      }
      bVar4 = eval_boolean(this,c,stack);
      pcVar16 = "false";
      if (bVar4) {
        pcVar16 = "true";
      }
      __return_storage_ptr__->_buffer = pcVar16;
      goto LAB_0016016c;
    }
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_c8._target;
    eval_node_set((xpath_node_set_raw *)local_a8,this,c,(xpath_stack *)local_68,nodeset_eval_first);
    if ((xml_node_struct *)CONCAT71(local_a8._9_7_,local_a8[8]) != local_98) {
      local_80 = (undefined1  [16])
                 xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),
                             (xpath_node *)local_98,local_a8._0_4_);
      string_value(__return_storage_ptr__,(xpath_node *)local_80,stack->result);
      goto LAB_00160658;
    }
    break;
  case '\x19':
    local_c8._target = (xpath_allocator *)(c->n)._node._root;
    local_c8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    aVar6.string = local_name((xpath_node *)&local_c8);
    goto LAB_00160169;
  case '\x1a':
    local_c8._target = stack->result;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_68 = (undefined1  [16])
               xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),(xpath_node *)local_98
                           ,local_a8._0_4_);
    pcVar16 = local_name((xpath_node *)local_68);
    goto LAB_00160488;
  case '\x1b':
    local_c8._target = (xpath_allocator *)(c->n)._node._root;
    local_c8._state._root = (xpath_memory_block *)(c->n)._attribute._attr;
    aVar6.string = namespace_uri((xpath_node *)&local_c8);
    goto LAB_00160169;
  case '\x1c':
    local_c8._target = stack->result;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    local_68 = (undefined1  [16])
               xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),(xpath_node *)local_98
                           ,local_a8._0_4_);
    pcVar16 = namespace_uri((xpath_node *)local_68);
    goto LAB_00160488;
  case '\x1d':
    pxVar10 = (xml_node_struct *)(c->n)._attribute._attr;
    if ((pxVar10 == (xml_node_struct *)0x0) &&
       (pxVar10 = (c->n)._node._root, pxVar10 == (xml_node_struct *)0x0)) goto LAB_00160162;
    aVar6.string = "";
    if (pxVar10->name != (char *)0x0) {
      aVar6.string = pxVar10->name;
    }
    goto LAB_00160169;
  case '\x1e':
    local_c8._target = stack->result;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    eval_node_set((xpath_node_set_raw *)local_a8,this->_left,c,stack,nodeset_eval_first);
    xVar31 = xpath_first((xpath_node *)CONCAT71(local_a8._9_7_,local_a8[8]),(xpath_node *)local_98,
                         local_a8._0_4_);
    xVar15._attr = xVar31._attribute._attr._attr;
    if ((xVar31._attribute._attr._attr != (xml_attribute_struct *)0x0) ||
       (xVar15._attr = (xml_attribute_struct *)xVar31._node._root._root,
       xVar31._node._root._root != (xml_node_struct *)0x0)) {
      pcVar16 = "";
      if (((xml_node_struct *)xVar15._attr)->name != (char *)0x0) {
        pcVar16 = ((xml_node_struct *)xVar15._attr)->name;
      }
      goto LAB_00160488;
    }
    break;
  case '\x1f':
    string_value(__return_storage_ptr__,&c->n,stack->result);
    return __return_storage_ptr__;
  case ' ':
    goto switchD_0015fa82_caseD_20;
  case '!':
    local_c8._target = stack->temp;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    lVar17 = 1;
    for (pxVar7 = this->_right; pxVar7 != (xpath_ast_node *)0x0; pxVar7 = pxVar7->_next) {
      lVar17 = lVar17 + 1;
    }
    local_48 = __return_storage_ptr__;
    pxVar10 = (xml_node_struct *)xpath_allocator::allocate(local_c8._target,lVar17 * 0x18);
    if (pxVar10 != (xml_node_struct *)0x0) {
      xVar1 = *stack;
      local_68._0_8_ = xVar1.temp;
      local_68._8_4_ = (int)xVar1.result;
      local_68._12_4_ = xVar1.result._4_4_;
      eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
      pxVar10->value = (char_t *)local_98;
      pxVar10->header = CONCAT44(local_a8._4_4_,local_a8._0_4_);
      pxVar10->name = (char_t *)CONCAT71(local_a8._9_7_,local_a8[8]);
      pxVar7 = this->_right;
      local_88._root = pxVar10;
      if (pxVar7 != (xpath_ast_node *)0x0) {
        do {
          eval_string((xpath_string *)local_a8,pxVar7,c,(xpath_stack *)local_68);
          pxVar10->prev_sibling_c = local_98;
          pxVar10->parent = (xml_node_struct *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
          pxVar10->first_child = (xml_node_struct *)CONCAT71(local_a8._9_7_,local_a8[8]);
          pxVar7 = pxVar7->_next;
          pxVar10 = (xml_node_struct *)&pxVar10->parent;
        } while (pxVar7 != (xpath_ast_node *)0x0);
      }
      xVar29._root = local_88._root;
      if (lVar17 == 0) {
        pcVar9 = (char_t *)0x1;
      }
      else {
        ppxVar23 = (xml_node_struct **)&(local_88._root)->value;
        pcVar9 = (char_t *)0x0;
        lVar24 = lVar17;
        do {
          if (*(char *)(ppxVar23 + -1) == '\x01') {
            pcVar18 = (char_t *)*ppxVar23;
          }
          else {
            pcVar18 = (char_t *)strlen((char *)((xml_node_struct *)(ppxVar23 + -2))->header);
          }
          pcVar9 = pcVar9 + (long)pcVar18;
          ppxVar23 = ppxVar23 + 3;
          lVar24 = lVar24 + -1;
        } while (lVar24 != 0);
        pcVar9 = pcVar9 + 1;
      }
      pcVar16 = (char *)xpath_allocator::allocate(stack->result,(size_t)pcVar9);
      if (pcVar16 == (char *)0x0) {
        pcVar16 = "";
        bVar4 = false;
        sVar14 = 0;
      }
      else {
        pcVar5 = pcVar16;
        if (lVar17 != 0) {
          lVar24 = 0;
          do {
            pcVar21 = (char *)(&(xVar29._root)->header)[lVar24 * 3];
            cVar2 = *pcVar21;
            while (cVar2 != '\0') {
              pcVar21 = pcVar21 + 1;
              *pcVar5 = cVar2;
              pcVar5 = pcVar5 + 1;
              cVar2 = *pcVar21;
            }
            lVar24 = lVar24 + 1;
          } while (lVar24 != lVar17);
        }
        *pcVar5 = '\0';
        sVar14 = (long)pcVar5 - (long)pcVar16;
        bVar4 = true;
      }
      local_48->_buffer = pcVar16;
      local_48->_uses_heap = bVar4;
      local_48->_length_heap = sVar14;
      __return_storage_ptr__ = local_48;
      goto LAB_00160658;
    }
    pcVar16 = "";
    __return_storage_ptr__ = local_48;
LAB_00160488:
    __return_storage_ptr__->_buffer = pcVar16;
LAB_0016064c:
    __return_storage_ptr__->_uses_heap = false;
    __return_storage_ptr__->_length_heap = 0;
    goto LAB_00160658;
  case '$':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_80._8_8_ = (xml_attribute_struct *)stack->result;
    local_80._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    pcVar16 = strstr((char *)CONCAT44(local_a8._4_4_,local_a8._0_4_),(char *)local_68._0_8_);
    if (pcVar16 != (char *)0x0) {
      xpath_string::from_heap
                (__return_storage_ptr__,(char *)CONCAT44(local_a8._4_4_,local_a8._0_4_),pcVar16,
                 stack->result);
      goto LAB_00160658;
    }
    break;
  case '%':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_80._8_8_ = (xml_attribute_struct *)stack->result;
    local_80._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_80);
    eval_string((xpath_string *)local_68,this->_right,c,(xpath_stack *)local_80);
    pcVar16 = (char *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    uVar3 = local_68._0_8_;
    pcVar5 = strstr(pcVar16,(char *)local_68._0_8_);
    if (pcVar5 == (char *)0x0) {
      pcVar5 = "";
    }
    else {
      if (local_68[8] != true) {
        local_58 = strlen((char *)uVar3);
      }
      if (local_a8[8] != true) {
        local_98 = (xml_node_struct *)strlen(pcVar16);
      }
      pcVar5 = pcVar5 + local_58;
      if (local_a8[8] != false) {
        xpath_string::from_heap
                  (__return_storage_ptr__,pcVar5,pcVar16 + (long)local_98,stack->result);
        goto LAB_00160658;
      }
    }
    __return_storage_ptr__->_buffer = pcVar5;
    goto LAB_0016064c;
  case '&':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    pxVar10 = local_98;
    if (local_a8[8] != true) {
      pxVar10 = (xml_node_struct *)strlen((char *)CONCAT44(local_a8._4_4_,local_a8._0_4_));
    }
    dVar27 = eval_number(this->_right,c,stack);
    local_80._0_8_ = floor(dVar27 + 0.5);
    pcVar16 = "";
    puVar25 = (undefined1 *)((long)&pxVar10->header + 1);
    auVar28._8_4_ = (int)((ulong)puVar25 >> 0x20);
    auVar28._0_8_ = puVar25;
    auVar28._12_4_ = 0x45300000;
    if ((auVar28._8_8_ - 1.9342813113834067e+25) +
        ((double)CONCAT44(0x43300000,(int)puVar25) - 4503599627370496.0) <= (double)local_80._0_8_)
    goto LAB_00160649;
    xVar29._root = (xml_node_struct *)0x3ff0000000000000;
    if (1.0 <= (double)local_80._0_8_) {
      xVar29._root = (xml_node_struct *)local_80._0_8_;
    }
    pcVar5 = (char *)CONCAT44(local_a8._4_4_,local_a8._0_4_);
    if (local_a8[8] != true) {
      local_98 = (xml_node_struct *)strlen(pcVar5);
    }
    pcVar16 = pcVar5 + (((long)((double)xVar29._root - 9.223372036854776e+18) &
                         (long)(double)xVar29._root >> 0x3f | (long)(double)xVar29._root) - 1);
    if (local_a8[8] != false) {
      xpath_string::from_heap(__return_storage_ptr__,pcVar16,pcVar5 + (long)local_98,stack->result);
      goto LAB_00160658;
    }
    goto LAB_00160649;
  case '\'':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_68._8_8_ = (xml_attribute_struct *)stack->result;
    local_68._0_8_ = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,(xpath_stack *)local_68);
    pxVar10 = local_98;
    if (local_a8[8] != true) {
      pxVar10 = (xml_node_struct *)strlen((char *)CONCAT44(local_a8._4_4_,local_a8._0_4_));
    }
    dVar27 = eval_number(this->_right,c,stack);
    local_88._root = (xml_node_struct *)floor(dVar27 + 0.5);
    dVar27 = eval_number(this->_right->_next,c,stack);
    dVar27 = floor(dVar27 + 0.5);
    local_80._0_8_ = local_88._root;
    pcVar16 = "";
    if (!NAN((double)local_88._root) && !NAN((double)local_88._root)) {
      local_80._0_8_ = dVar27 + (double)local_88._root;
      if (!NAN((double)local_80._0_8_) && !NAN((double)local_80._0_8_)) {
        puVar25 = (undefined1 *)((long)&pxVar10->header + 1);
        auVar30._8_4_ = (int)((ulong)puVar25 >> 0x20);
        auVar30._0_8_ = puVar25;
        auVar30._12_4_ = 0x45300000;
        dVar27 = (auVar30._8_8_ - 1.9342813113834067e+25) +
                 ((double)CONCAT44(0x43300000,(int)puVar25) - 4503599627370496.0);
        if ((((double)local_88._root < dVar27) && ((double)local_88._root < (double)local_80._0_8_))
           && (1.0 <= (double)local_80._0_8_)) {
          xVar29._root = (xml_node_struct *)0x3ff0000000000000;
          if (1.0 <= (double)local_88._root) {
            xVar29._root = local_88._root;
          }
          puVar11 = (undefined1 *)
                    ((long)(double)local_80._0_8_ >> 0x3f &
                     (long)((double)local_80._0_8_ - 9.223372036854776e+18) |
                    (long)(double)local_80._0_8_);
          if (dVar27 <= (double)local_80._0_8_) {
            puVar11 = puVar25;
          }
          pcVar16 = (char *)(CONCAT44(local_a8._4_4_,local_a8._0_4_) +
                             ((long)((double)xVar29._root - 9.223372036854776e+18) &
                              (long)(double)xVar29._root >> 0x3f | (long)(double)xVar29._root) + -1)
          ;
          if ((puVar11 != puVar25) || (local_a8[8] == true)) {
            xpath_string::from_heap
                      (__return_storage_ptr__,pcVar16,
                       puVar11 + CONCAT44(local_a8._4_4_,local_a8._0_4_) + -1,stack->result);
            goto LAB_00160658;
          }
        }
      }
    }
LAB_00160649:
    __return_storage_ptr__->_buffer = pcVar16;
    goto LAB_0016064c;
  case '*':
    string_value((xpath_string *)&local_c8,&c->n,stack->result);
    goto LAB_0015fe25;
  case '+':
    eval_string((xpath_string *)&local_c8,this->_left,c,stack);
LAB_0015fe25:
    pcVar9 = xpath_string::data((xpath_string *)&local_c8,stack->result);
    bVar4 = pcVar9 == (char_t *)0x0;
    if (bVar4) {
      pcVar9 = "";
      sVar14 = 0;
    }
    else {
      pcVar18 = normalize_space(pcVar9);
      sVar14 = (long)pcVar18 - (long)pcVar9;
    }
    __return_storage_ptr__->_buffer = pcVar9;
    __return_storage_ptr__->_uses_heap = !bVar4;
    __return_storage_ptr__->_length_heap = sVar14;
    return __return_storage_ptr__;
  case ',':
    local_c8._target = stack->temp;
    local_c8._state._root = (xpath_memory_block *)((xml_node_struct *)local_c8._target)->header;
    local_c8._state._root_size = (size_t)((xml_node_struct *)local_c8._target)->name;
    local_c8._state._error = (bool *)((xml_node_struct *)local_c8._target)->value;
    local_40.temp = stack->result;
    local_40.result = local_c8._target;
    eval_string((xpath_string *)local_a8,this->_left,c,stack);
    eval_string((xpath_string *)local_68,this->_right,c,&local_40);
    eval_string((xpath_string *)local_80,this->_right->_next,c,&local_40);
    pcVar9 = xpath_string::data((xpath_string *)local_a8,stack->result);
    if (pcVar9 == (char_t *)0x0) {
      pcVar9 = "";
      bVar4 = false;
      sVar14 = 0;
      local_48 = __return_storage_ptr__;
      goto LAB_00160563;
    }
    __s = local_68._0_8_;
    uVar3 = local_80._0_8_;
    local_48 = __return_storage_ptr__;
    if (local_80[8] != true) {
      local_70 = strlen((char *)local_80._0_8_);
    }
    cVar26 = *pcVar9;
    pcVar18 = pcVar9;
    pcVar19 = pcVar9;
    goto joined_r0x0016051c;
  case ':':
    eval_string((xpath_string *)&local_c8,this->_left,c,stack);
    pbVar8 = (byte *)xpath_string::data((xpath_string *)&local_c8,stack->result);
    if (pbVar8 == (byte *)0x0) {
      pbVar8 = (byte *)0x16ad89;
      bVar4 = false;
      sVar14 = 0;
    }
    else {
      bVar22 = *pbVar8;
      pbVar13 = pbVar8;
      if (bVar22 != 0) {
        pcVar9 = (this->_data).string;
        pbVar20 = pbVar8;
        do {
          pbVar20 = pbVar20 + 1;
          if ((char)bVar22 < '\0') {
            *pbVar13 = bVar22;
            pbVar13 = pbVar13 + 1;
          }
          else {
            bVar22 = pcVar9[bVar22];
            *pbVar13 = bVar22;
            pbVar13 = pbVar13 + (-1 < (char)bVar22);
          }
          bVar22 = *pbVar20;
        } while (bVar22 != 0);
      }
      *pbVar13 = 0;
      sVar14 = (long)pbVar13 - (long)pbVar8;
      bVar4 = true;
    }
    __return_storage_ptr__->_buffer = (char_t *)pbVar8;
    __return_storage_ptr__->_uses_heap = bVar4;
    __return_storage_ptr__->_length_heap = sVar14;
    return __return_storage_ptr__;
  }
  pcVar16 = "";
  goto LAB_00160488;
joined_r0x0016051c:
  if (cVar26 == '\0') goto LAB_00160556;
  pcVar19 = (char_t *)((long)pcVar19 + 1);
  pcVar16 = strchr((char *)__s,(int)cVar26);
  if (pcVar16 == (char *)0x0) {
LAB_00160544:
    *pcVar18 = cVar26;
    pcVar18 = (char_t *)((long)pcVar18 + 1);
  }
  else {
    uVar12 = (long)pcVar16 - __s;
    if (uVar12 < local_70) {
      cVar26 = *(char_t *)(uVar3 + uVar12);
      goto LAB_00160544;
    }
  }
  cVar26 = *pcVar19;
  goto joined_r0x0016051c;
switchD_0015fa82_caseD_20:
  this = this->_left;
  goto LAB_0015fa6a;
switchD_0015fa82_caseD_12:
  aVar6 = this->_data;
LAB_00160169:
  __return_storage_ptr__->_buffer = (char_t *)aVar6;
LAB_0016016c:
  __return_storage_ptr__->_uses_heap = false;
  __return_storage_ptr__->_length_heap = 0;
  return __return_storage_ptr__;
LAB_00160556:
  *pcVar18 = '\0';
  sVar14 = (long)pcVar18 - (long)pcVar9;
  bVar4 = true;
LAB_00160563:
  local_48->_buffer = pcVar9;
  local_48->_uses_heap = bVar4;
  local_48->_length_heap = sVar14;
  __return_storage_ptr__ = local_48;
LAB_00160658:
  xpath_allocator_capture::~xpath_allocator_capture(&local_c8);
  return __return_storage_ptr__;
}

Assistant:

xpath_string eval_string(const xpath_context& c, const xpath_stack& stack)
		{
			switch (_type)
			{
			case ast_string_constant:
				return xpath_string::from_const(_data.string);

			case ast_func_local_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_local_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(local_name(na));
			}

			case ast_func_name_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_name_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(qualified_name(na));
			}

			case ast_func_namespace_uri_0:
			{
				xpath_node na = c.n;

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_namespace_uri_1:
			{
				xpath_allocator_capture cr(stack.result);

				xpath_node_set_raw ns = _left->eval_node_set(c, stack, nodeset_eval_first);
				xpath_node na = ns.first();

				return xpath_string::from_const(namespace_uri(na));
			}

			case ast_func_string_0:
				return string_value(c.n, stack.result);

			case ast_func_string_1:
				return _left->eval_string(c, stack);

			case ast_func_concat:
				return eval_string_concat(c, stack);

			case ast_func_substring_before:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());

				return pos ? xpath_string::from_heap(s.c_str(), pos, stack.result) : xpath_string();
			}

			case ast_func_substring_after:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				xpath_string p = _right->eval_string(c, swapped_stack);

				const char_t* pos = find_substring(s.c_str(), p.c_str());
				if (!pos) return xpath_string();

				const char_t* rbegin = pos + p.length();
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_2:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));

				if (is_nan(first)) return xpath_string(); // NaN
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				assert(1 <= pos && pos <= s_length + 1);

				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + s.length();

				return s.uses_heap() ? xpath_string::from_heap(rbegin, rend, stack.result) : xpath_string::from_const(rbegin);
			}

			case ast_func_substring_3:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, swapped_stack);
				size_t s_length = s.length();

				double first = round_nearest(_right->eval_number(c, stack));
				double last = first + round_nearest(_right->_next->eval_number(c, stack));

				if (is_nan(first) || is_nan(last)) return xpath_string();
				else if (first >= static_cast<double>(s_length + 1)) return xpath_string();
				else if (first >= last) return xpath_string();
				else if (last < 1) return xpath_string();

				size_t pos = first < 1 ? 1 : static_cast<size_t>(first);
				size_t end = last >= static_cast<double>(s_length + 1) ? s_length + 1 : static_cast<size_t>(last);

				assert(1 <= pos && pos <= end && end <= s_length + 1);
				const char_t* rbegin = s.c_str() + (pos - 1);
				const char_t* rend = s.c_str() + (end - 1);

				return (end == s_length + 1 && !s.uses_heap()) ? xpath_string::from_const(rbegin) : xpath_string::from_heap(rbegin, rend, stack.result);
			}

			case ast_func_normalize_space_0:
			{
				xpath_string s = string_value(c.n, stack.result);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_normalize_space_1:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = normalize_space(begin);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_func_translate:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_string s = _left->eval_string(c, stack);
				xpath_string from = _right->eval_string(c, swapped_stack);
				xpath_string to = _right->_next->eval_string(c, swapped_stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate(begin, from.c_str(), to.c_str(), to.length());

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_opt_translate_table:
			{
				xpath_string s = _left->eval_string(c, stack);

				char_t* begin = s.data(stack.result);
				if (!begin) return xpath_string();

				char_t* end = translate_table(begin, _data.table);

				return xpath_string::from_heap_preallocated(begin, end);
			}

			case ast_variable:
			{
				assert(_rettype == _data.variable->type());

				if (_rettype == xpath_type_string)
					return xpath_string::from_const(_data.variable->get_string());

				// variable needs to be converted to the correct type, this is handled by the fallthrough block below
				break;
			}

			default:
				;
			}

			// none of the ast types that return the value directly matched, we need to perform type conversion
			switch (_rettype)
			{
			case xpath_type_boolean:
				return xpath_string::from_const(eval_boolean(c, stack) ? PUGIXML_TEXT("true") : PUGIXML_TEXT("false"));

			case xpath_type_number:
				return convert_number_to_string(eval_number(c, stack), stack.result);

			case xpath_type_node_set:
			{
				xpath_allocator_capture cr(stack.temp);

				xpath_stack swapped_stack = {stack.temp, stack.result};

				xpath_node_set_raw ns = eval_node_set(c, swapped_stack, nodeset_eval_first);
				return ns.empty() ? xpath_string() : string_value(ns.first(), stack.result);
			}

			default:
				assert(false && "Wrong expression for return type string"); // unreachable
				return xpath_string();
			}
		}